

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O0

void jacobi_ek_compute(int n,double alpha,double beta,double *x,double *w)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  double *e;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double zemu;
  double i_r8;
  int i;
  double *bj;
  double abi;
  double *w_local;
  double *x_local;
  double beta_local;
  double alpha_local;
  int n_local;
  
  dVar3 = pow(2.0,alpha + beta + 1.0);
  dVar4 = r8_gamma(alpha + 1.0);
  dVar5 = r8_gamma(beta + 1.0);
  dVar6 = r8_gamma(alpha + 2.0 + beta);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)n;
  uVar2 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  e = (double *)operator_new__(uVar2);
  *x = (beta - alpha) / (alpha + 2.0 + beta);
  *e = ((alpha + 1.0) * 4.0 * (beta + 1.0)) /
       ((alpha + 3.0 + beta) * (alpha + 2.0 + beta) * (alpha + 2.0 + beta));
  for (i_r8._4_4_ = 1; i_r8._4_4_ < n; i_r8._4_4_ = i_r8._4_4_ + 1) {
    dVar7 = (double)(i_r8._4_4_ + 1);
    dVar8 = dVar7 + dVar7 + alpha + beta;
    x[i_r8._4_4_] = ((beta + alpha) * (beta - alpha)) / ((dVar8 - 2.0) * dVar8);
    e[i_r8._4_4_] =
         (dVar7 * 4.0 * (dVar7 + alpha) * (dVar7 + beta) * (dVar7 + alpha + beta)) /
         ((dVar8 - 1.0) * (dVar8 + 1.0) * dVar8 * dVar8);
  }
  for (i_r8._4_4_ = 0; i_r8._4_4_ < n; i_r8._4_4_ = i_r8._4_4_ + 1) {
    dVar7 = sqrt(e[i_r8._4_4_]);
    e[i_r8._4_4_] = dVar7;
  }
  dVar3 = sqrt((dVar3 * dVar4 * dVar5) / dVar6);
  *w = dVar3;
  for (i_r8._4_4_ = 1; i_r8._4_4_ < n; i_r8._4_4_ = i_r8._4_4_ + 1) {
    w[i_r8._4_4_] = 0.0;
  }
  imtqlx(n,x,e,w);
  for (i_r8._4_4_ = 0; i_r8._4_4_ < n; i_r8._4_4_ = i_r8._4_4_ + 1) {
    w[i_r8._4_4_] = w[i_r8._4_4_] * w[i_r8._4_4_];
  }
  if (e != (double *)0x0) {
    operator_delete__(e);
  }
  return;
}

Assistant:

void jacobi_ek_compute ( int n, double alpha, double beta, double x[], 
  double w[] )

//****************************************************************************80
//
//  Purpose:
//
//    JACOBI_EK_COMPUTE: Elhay-Kautsky method for Gauss-Jacobi quadrature rule.
//
//  Discussion:
//
//    The integral:
//
//      Integral ( -1 <= X <= 1 ) (1-X)**ALPHA * (1+X)**BETA * F(X) dX
//
//    The quadrature rule:
//
//      Sum ( 1 <= I <= ORDER ) WEIGHT(I) * F ( XTAB(I) )
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    30 April 2011
//
//  Author:
//
//    Original FORTRAN77 version by Sylvan Elhay, Jaroslav Kautsky.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Sylvan Elhay, Jaroslav Kautsky,
//    Algorithm 655: IQPACK, FORTRAN Subroutines for the Weights of
//    Interpolatory Quadrature,
//    ACM Transactions on Mathematical Software,
//    Volume 13, Number 4, December 1987, pages 399-415.
//
//  Parameters:
//
//    Input, int N, the order.
//
//    Input, double ALPHA, BETA, the exponents of (1-X) and
//    (1+X) in the quadrature rule.  For simple Gauss-Legendre quadrature,
//    set ALPHA = BETA = 0.0.  -1.0 < ALPHA and -1.0 < BETA are required.
//
//    Output, double X[N], the abscissas.
//
//    Output, double W[N], the weights.
//
{
  double abi;
  double *bj;
  int i;
  double i_r8;
  double zemu;
//
//  Define the zero-th moment.
//
  zemu = pow ( 2.0, alpha + beta + 1.0 )
    * r8_gamma ( alpha + 1.0 ) 
    * r8_gamma ( beta + 1.0 ) 
    / r8_gamma ( 2.0 + alpha + beta );
//
//  Define the Jacobi matrix.
//
  bj = new double[n];

  x[0] = ( beta - alpha ) / ( 2.0 + alpha + beta );

  bj[0] = 4.0 * ( 1.0 + alpha ) * ( 1.0 + beta ) 
    / ( ( 3.0 + alpha + beta ) 
      * ( 2.0 + alpha + beta ) * ( 2.0 + alpha + beta ) );

  for ( i = 1; i < n; i++ )
  {
    i_r8 = double( i + 1 );
    abi = 2.0 * i_r8 + alpha + beta;
    x[i] = ( beta + alpha ) * ( beta - alpha ) / ( ( abi - 2.0 ) * abi );
    bj[i] = 4.0 * i_r8 * ( i_r8 + alpha ) * ( i_r8 + beta ) 
      * ( i_r8 + alpha + beta ) 
      / ( ( abi - 1.0 ) * ( abi + 1.0 ) * abi * abi );
  }

  for ( i = 0; i < n; i++ )
  {
    bj[i] = sqrt ( bj[i] );
  }

  w[0] = sqrt ( zemu );

  for ( i = 1; i < n; i++ )
  {
    w[i] = 0.0;
  }
//
//  Diagonalize the Jacobi matrix.
//
  imtqlx ( n, x, bj, w );

  for ( i = 0; i < n; i++ )
  {
    w[i] = w[i] * w[i];
  }

  delete [] bj;

  return;
}